

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O1

ColumnSegment * __thiscall
duckdb::SegmentTree<duckdb::ColumnSegment,_false>::GetRootSegment
          (SegmentTree<duckdb::ColumnSegment,_false> *this)

{
  reference pvVar1;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> _Var2;
  SegmentLock l;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = &this->node_lock;
  local_20._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  if ((this->nodes).
      super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      .
      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->nodes).
      super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      .
      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    _Var2._M_head_impl = (ColumnSegment *)0x0;
  }
  else {
    pvVar1 = vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::operator[](&this->nodes,0);
    _Var2._M_head_impl =
         (pvVar1->node).
         super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
         super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
         .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return _Var2._M_head_impl;
}

Assistant:

T *GetRootSegment() {
		auto l = Lock();
		return GetRootSegment(l);
	}